

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O1

Map_Cut_t * Map_CutTableConsider(Map_Man_t *pMan,Map_CutTable_t *p,Map_Node_t **ppNodes,int nNodes)

{
  int iVar1;
  uint uVar2;
  Map_Cut_t *pMVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  
  uVar7 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar2 = 0;
  }
  else {
    lVar5 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + *(int *)(*(long *)((long)ppNodes + lVar5 * 2) + 0x10) *
                      *(int *)((long)s_HashPrimes + lVar5);
      lVar5 = lVar5 + 4;
    } while (uVar7 * 4 - lVar5 != 0);
  }
  uVar4 = (ulong)uVar2 % (ulong)(uint)p->nBins;
  do {
    iVar8 = (int)uVar4;
    pMVar3 = p->pBins[iVar8];
    if (pMVar3 == (Map_Cut_t *)0x0) {
LAB_003fdb43:
      if (iVar8 == -1) {
        pMVar3 = (Map_Cut_t *)0x0;
      }
      else {
        if (nNodes < 1) {
          __assert_fail("nNodes > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                        ,0x3a0,
                        "Map_Cut_t *Map_CutTableConsider(Map_Man_t *, Map_CutTable_t *, Map_Node_t **, int)"
                       );
        }
        pMVar3 = Map_CutAlloc(pMan);
        pMVar3->nLeaves = (char)nNodes;
        uVar4 = 0;
        do {
          pMVar3->ppLeaves[uVar4] = ppNodes[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar7 != uVar4);
        if (p->pBins[iVar8] != (Map_Cut_t *)0x0) {
          __assert_fail("p->pBins[Place] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                        ,0x3a9,
                        "Map_Cut_t *Map_CutTableConsider(Map_Man_t *, Map_CutTable_t *, Map_Node_t **, int)"
                       );
        }
        p->pBins[iVar8] = pMVar3;
        iVar1 = p->nCuts;
        p->nCuts = iVar1 + 1;
        p->pCuts[iVar1] = iVar8;
      }
      return pMVar3;
    }
    if (pMVar3->nLeaves == nNodes) {
      uVar6 = 0;
      uVar4 = uVar6;
      if (0 < nNodes) {
        do {
          uVar4 = uVar6;
          if (pMVar3->ppLeaves[uVar6] != ppNodes[uVar6]) break;
          uVar6 = uVar6 + 1;
          uVar4 = uVar7;
        } while (uVar7 != uVar6);
      }
      if ((int)uVar4 == nNodes) {
        iVar8 = -1;
        goto LAB_003fdb43;
      }
    }
    uVar4 = (long)(iVar8 + 1) % (long)p->nBins & 0xffffffff;
  } while( true );
}

Assistant:

Map_Cut_t * Map_CutTableConsider( Map_Man_t * pMan, Map_CutTable_t * p, Map_Node_t * ppNodes[], int nNodes )
{
    Map_Cut_t * pCut;
    int Place, i;
//    abctime clk;
    // check the cut
    Place = Map_CutTableLookup( p, ppNodes, nNodes );
    if ( Place == -1 )
        return NULL;
    assert( nNodes > 0 );
    // create the new cut
//clk = Abc_Clock();
    pCut = Map_CutAlloc( pMan );
//pMan->time1 += Abc_Clock() - clk;
    pCut->nLeaves = nNodes;
    for ( i = 0; i < nNodes; i++ )
        pCut->ppLeaves[i] = ppNodes[i];
    // add the cut to the table
    assert( p->pBins[Place] == NULL );
    p->pBins[Place] = pCut;
    // add the cut to the new list
    p->pCuts[ p->nCuts++ ] = Place;
    return pCut;
}